

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprog.c
# Opt level: O3

void speech_prog_elven_down(ROOM_INDEX_DATA *room,CHAR_DATA *ch,char *speech)

{
  bool bVar1;
  CHAR_DATA *pCVar2;
  AFFECT_DATA af;
  ROOM_AFFECT_DATA raf;
  AFFECT_DATA local_e0;
  ROOM_AFFECT_DATA local_78;
  
  bVar1 = is_npc(ch);
  if (!bVar1) {
    bVar1 = str_cmp(speech,"hakri gwenidill mafre finae");
    if (!bVar1) {
      bVar1 = is_affected_room(ch->in_room,(int)gsn_rprog_elven_down);
      if (!bVar1) {
        init_affect_room(&local_78);
        local_78.where = 0;
        local_78.type = gsn_rprog_elven_down;
        local_78.aftype = 7;
        local_78.duration = 0;
        affect_to_room(ch->in_room,&local_78);
        act("A chill wind blows through the room, extinguishing the candle.",ch,(void *)0x0,
            (void *)0x0,3);
        act("A chill wind blows through the room, extinguishing the candle.",ch,(void *)0x0,
            (void *)0x0,0);
        pCVar2 = ch->in_room->people;
        if (pCVar2 != (CHAR_DATA *)0x0) {
          do {
            init_affect(&local_e0);
            local_e0.where = 0;
            local_e0.aftype = 5;
            local_e0.duration = 0;
            local_e0.bitvector[0]._0_1_ = (byte)local_e0.bitvector[0] | 1;
            local_e0.end_fun = rprog_elven_down_end;
            new_affect_to_char(ch,&local_e0);
            pCVar2 = pCVar2->next_in_room;
          } while (pCVar2 != (CHAR_DATA *)0x0);
        }
      }
    }
  }
  return;
}

Assistant:

void speech_prog_elven_down(ROOM_INDEX_DATA *room, CHAR_DATA *ch, char *speech)
{
	AFFECT_DATA af;
	ROOM_AFFECT_DATA raf;
	CHAR_DATA *ich = nullptr;

	if (is_npc(ch))
		return;

	if (!str_cmp(speech, "hakri gwenidill mafre finae"))
	{
		if (is_affected_room(ch->in_room, gsn_rprog_elven_down))
			return;

		init_affect_room(&raf);
		raf.where = TO_ROOM_AFFECTS;
		raf.type = gsn_rprog_elven_down;
		raf.aftype = AFT_TIMER;
		raf.duration = 0;
		affect_to_room(ch->in_room, &raf);

		act("A chill wind blows through the room, extinguishing the candle.", ch, 0, 0, TO_CHAR);
		act("A chill wind blows through the room, extinguishing the candle.", ch, 0, 0, TO_ROOM);

		for (ich = ch->in_room->people; ich != nullptr; ich = ich->next_in_room)
		{
			// Small char affect that will restore the original light after a tick.
			init_affect(&af);
			af.where = TO_AFFECTS;
			af.aftype = AFT_INVIS;
			af.duration = 0;

			SET_BIT(af.bitvector, AFF_BLIND);

			af.end_fun = rprog_elven_down_end;
			new_affect_to_char(ch, &af);
		}
	}
}